

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O2

void __thiscall Arena_Zero_Test::~Arena_Zero_Test(Arena_Zero_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Arena, Zero) {
  memt::Arena arena;
  void* a = arena.alloc(0);
  void* b = arena.alloc(0);
  void* c = arena.alloc(0);
  ASSERT_NE(a, b);
  ASSERT_NE(a, c);
  ASSERT_NE(b, c);
  ASSERT_FALSE(arena.isEmpty());
}